

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::MultAdd
          (TPZSkylMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *x
          ,TPZFMatrix<std::complex<long_double>_> *y,TPZFMatrix<std::complex<long_double>_> *z,
          complex<long_double> alpha,complex<long_double> beta,int opt)

{
  complex<long_double> **ppcVar1;
  complex<long_double> *pcVar2;
  TPZFMatrix<std::complex<long_double>_> *this_00;
  long lVar3;
  ostream *poVar4;
  complex<long_double> *pcVar5;
  long lVar6;
  long lVar7;
  longdouble *plVar8;
  int64_t iVar9;
  complex<long_double> *__z;
  complex<long_double> *pcVar10;
  TPZSkylMatrix<std::complex<long_double>_> *pTVar11;
  longdouble lVar12;
  longdouble lVar13;
  complex<long_double> __r_4;
  complex<long_double> local_108;
  complex<long_double> local_e8;
  TPZSkylMatrix<std::complex<long_double>_> *local_c8;
  long local_c0;
  long local_b8;
  TPZFMatrix<std::complex<long_double>_> *local_b0;
  complex<long_double> local_a8;
  long local_80;
  TPZFMatrix<std::complex<long_double>_> *local_78;
  long local_70;
  long local_68;
  long local_60;
  undefined1 local_58 [40];
  
  if (opt == 0) {
    iVar9 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
    if (iVar9 == (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow)
    goto LAB_00d56025;
LAB_00d5602b:
    TPZMatrix<std::complex<long_double>_>::Error
              ("virtual void TPZSkylMatrix<std::complex<long double>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<long double>]"
               ," <matrixs with incompatible dimensions>");
    iVar9 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  }
  else {
    iVar9 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
LAB_00d56025:
    if ((this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow != iVar9)
    goto LAB_00d5602b;
  }
  local_c8 = this;
  if ((z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow == iVar9) {
    lVar3 = (z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
    lVar7 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
    lVar6 = lVar3;
    if (lVar3 == lVar7) goto LAB_00d56078;
  }
  else {
    lVar7 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  }
  (*(z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xe])(z,iVar9,lVar7);
  lVar3 = (z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  lVar6 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
LAB_00d56078:
  if ((((lVar6 != (y->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol) ||
       (lVar6 != lVar3)) ||
      (lVar7 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow,
      lVar7 != (y->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow)) ||
     (lVar7 != (z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"x.Cols = ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," y.Cols()");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," z.Cols() ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," x.Rows() ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," y.Rows() ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," z.Rows() ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    TPZMatrix<std::complex<long_double>_>::Error
              ("virtual void TPZSkylMatrix<std::complex<long double>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<long double>]"
               ," incompatible dimensions\n");
  }
  pTVar11 = local_c8;
  local_78 = z;
  TPZMatrix<std::complex<long_double>_>::PrepareZ
            (&local_c8->super_TPZMatrix<std::complex<long_double>_>,y,z,beta,opt);
  local_70 = (pTVar11->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  local_80 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  local_c0 = 0;
  if (local_70 < 1) {
    local_70 = local_c0;
  }
  if (local_80 < 1) {
    local_80 = local_c0;
  }
  local_b0 = x;
  for (; local_c0 != local_80; local_c0 = local_c0 + 1) {
    for (local_b8 = 0; local_b8 != local_70; local_b8 = local_b8 + 1) {
      ppcVar1 = (pTVar11->fElem).fStore;
      local_60 = (long)ppcVar1[local_b8 + 1] - (long)ppcVar1[local_b8];
      local_e8._M_value._0_8_ = SUB108((longdouble)0,0);
      local_e8._M_value._8_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
      local_68 = (local_b8 - (local_60 >> 5)) + 1;
      pcVar5 = x->fElem +
               (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow * local_c0
               + local_68;
      pcVar2 = ppcVar1[local_b8];
      lVar7 = local_60;
      local_e8._M_value._16_8_ = local_e8._M_value._0_8_;
      local_e8._M_value._24_2_ = local_e8._M_value._8_2_;
      while( true ) {
        pcVar10 = (complex<long_double> *)(pcVar2[-1]._M_value + lVar7);
        if (pcVar10 <= pcVar2) break;
        if (opt == 0) {
          local_108._M_value._0_8_ = SUB108(*(unkbyte10 *)(pcVar2[-1]._M_value + lVar7),0);
          local_108._M_value._8_2_ =
               SUB102((unkuint10)*(unkbyte10 *)(pcVar2[-1]._M_value + lVar7) >> 0x40,0);
          local_108._M_value._16_8_ = SUB108(-*(longdouble *)(pcVar2[-1]._M_value + lVar7 + 0x10),0)
          ;
          local_108._M_value._24_2_ =
               SUB102((unkuint10)-*(longdouble *)(pcVar2[-1]._M_value + lVar7 + 0x10) >> 0x40,0);
        }
        else {
          local_108._M_value._0_8_ = *(undefined8 *)pcVar10->_M_value;
          local_108._M_value._16_8_ = *(undefined8 *)(pcVar10->_M_value + 0x10);
          local_108._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar10->_M_value + 0x18),0);
          local_108._M_value._26_6_ =
               SUB86((ulong)*(undefined8 *)(pcVar10->_M_value + 0x18) >> 0x10,0);
          local_108._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar10->_M_value + 8),0);
          local_108._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar10->_M_value + 8) >> 0x10,0)
          ;
        }
        std::complex<long_double>::operator*=(&local_108,pcVar5);
        lVar13 = (longdouble)CONCAT28(local_e8._M_value._8_2_,local_e8._M_value._0_8_) +
                 (longdouble)CONCAT28(local_108._M_value._8_2_,local_108._M_value._0_8_);
        lVar12 = (longdouble)CONCAT28(local_e8._M_value._24_2_,local_e8._M_value._16_8_) +
                 (longdouble)CONCAT28(local_108._M_value._24_2_,local_108._M_value._16_8_);
        local_e8._M_value._0_8_ = SUB108(lVar13,0);
        local_e8._M_value._8_2_ = SUB102((unkuint10)lVar13 >> 0x40,0);
        local_e8._M_value._16_8_ = SUB108(lVar12,0);
        local_e8._M_value._24_2_ = SUB102((unkuint10)lVar12 >> 0x40,0);
        pcVar5 = pcVar5 + 1;
        lVar7 = lVar7 + -0x20;
      }
      if (lVar7 + -0x20 == 0) {
        local_108._M_value._0_8_ = *(undefined8 *)pcVar2->_M_value;
        local_108._M_value._16_8_ = *(undefined8 *)(pcVar2->_M_value + 0x10);
        local_108._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar2->_M_value + 0x18),0);
        local_108._M_value._26_6_ = SUB86((ulong)*(undefined8 *)(pcVar2->_M_value + 0x18) >> 0x10,0)
        ;
        local_108._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar2->_M_value + 8),0);
        local_108._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar2->_M_value + 8) >> 0x10,0);
        std::complex<long_double>::operator*=(&local_108,pcVar5);
        lVar13 = (longdouble)CONCAT28(local_e8._M_value._8_2_,local_e8._M_value._0_8_) +
                 (longdouble)CONCAT28(local_108._M_value._8_2_,local_108._M_value._0_8_);
        lVar12 = (longdouble)CONCAT28(local_e8._M_value._24_2_,local_e8._M_value._16_8_) +
                 (longdouble)CONCAT28(local_108._M_value._24_2_,local_108._M_value._16_8_);
        local_e8._M_value._0_8_ = SUB108(lVar13,0);
        local_e8._M_value._8_2_ = SUB102((unkuint10)lVar13 >> 0x40,0);
        local_e8._M_value._16_8_ = SUB108(lVar12,0);
        local_e8._M_value._24_2_ = SUB102((unkuint10)lVar12 >> 0x40,0);
      }
      local_108._M_value._16_8_ = local_e8._M_value._16_8_;
      local_108._M_value._24_2_ = local_e8._M_value._24_2_;
      local_108._M_value._26_6_ = local_e8._M_value._26_6_;
      local_108._M_value._0_8_ = local_e8._M_value._0_8_;
      local_108._M_value._8_2_ = local_e8._M_value._8_2_;
      local_108._M_value._10_6_ = local_e8._M_value._10_6_;
      std::complex<long_double>::operator*=(&local_108,&alpha);
      this_00 = local_78;
      lVar7 = local_c0;
      pcVar5 = TPZFMatrix<std::complex<long_double>_>::operator()(local_78,local_b8,local_c0);
      lVar12 = *(longdouble *)(pcVar5->_M_value + 0x10);
      *(longdouble *)pcVar5->_M_value =
           *(longdouble *)pcVar5->_M_value +
           (longdouble)CONCAT28(local_108._M_value._8_2_,local_108._M_value._0_8_);
      *(longdouble *)(pcVar5->_M_value + 0x10) =
           lVar12 + (longdouble)CONCAT28(local_108._M_value._24_2_,local_108._M_value._16_8_);
      pcVar5 = TPZFMatrix<std::complex<long_double>_>::operator()(this_00,local_68,lVar7);
      lVar7 = local_b8;
      (*(local_b0->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable
        ._vptr_TPZSavable[0x24])(&local_108,local_b0,local_b8,local_c0);
      local_e8._M_value._16_8_ = local_108._M_value._16_8_;
      local_e8._M_value._24_2_ = local_108._M_value._24_2_;
      local_e8._M_value._26_6_ = local_108._M_value._26_6_;
      local_e8._M_value._0_8_ = local_108._M_value._0_8_;
      local_e8._M_value._8_2_ = local_108._M_value._8_2_;
      local_e8._M_value._10_6_ = local_108._M_value._10_6_;
      plVar8 = (longdouble *)(pcVar5->_M_value + 0x10);
      pcVar5 = (complex<long_double> *)((local_c8->fElem).fStore[lVar7]->_M_value + local_60);
      while (pcVar10 = pcVar5 + -1, pcVar2 < pcVar10) {
        __z = pcVar10;
        if (opt != 0) {
          local_58._0_10_ = *(unkbyte10 *)pcVar10->_M_value;
          local_58._16_10_ = -*(longdouble *)(pcVar5[-1]._M_value + 0x10);
          __z = (complex<long_double> *)local_58;
        }
        local_a8._M_value._24_8_ = alpha._M_value._24_8_;
        local_a8._M_value._16_8_ = alpha._M_value._16_8_;
        local_a8._M_value._8_8_ = alpha._M_value._8_8_;
        local_a8._M_value._0_8_ = alpha._M_value._0_8_;
        std::complex<long_double>::operator*=(&local_a8,__z);
        local_108._M_value._0_8_ = local_a8._M_value._0_8_;
        local_108._M_value._8_2_ = local_a8._M_value._8_2_;
        local_108._M_value._10_6_ = local_a8._M_value._10_6_;
        local_108._M_value._16_8_ = local_a8._M_value._16_8_;
        local_108._M_value._24_2_ = local_a8._M_value._24_2_;
        local_108._M_value._26_6_ = local_a8._M_value._26_6_;
        std::complex<long_double>::operator*=(&local_108,&local_e8);
        plVar8[-1] = plVar8[-1] +
                     (longdouble)CONCAT28(local_108._M_value._8_2_,local_108._M_value._0_8_);
        *plVar8 = *plVar8 + (longdouble)
                            CONCAT28(local_108._M_value._24_2_,local_108._M_value._16_8_);
        plVar8 = plVar8 + 2;
        pcVar5 = pcVar10;
      }
      x = local_b0;
      pTVar11 = local_c8;
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	
	if (this->fDecomposed != ENoDecompose) {
        //		DebugStop();
	}
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," <matrixs with incompatible dimensions>" );
	if(z.Rows() != x.Rows() || z.Cols() != x.Cols()) z.Redim(x.Rows(),x.Cols());
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		cout << "x.Cols = " << x.Cols() << " y.Cols()"<< y.Cols() << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows() << " y.Rows() "<< y.Rows() << " z.Rows() "<< z.Rows() << endl;
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);

	const int64_t rows = this->Rows();
	const int64_t xcols = x.Cols();
	for (auto ic = 0; ic < xcols; ic++) {
		for(auto r = 0 ; r < rows ; r++ ) {
			const int64_t offset = Size(r);
			TVar val = 0.;
			const TVar *p = &x.g((r-offset+1),ic);
			TVar *diag = fElem[r] + offset-1;
			const TVar *diaglast = fElem[r];
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) val += *diag-- * *p;
                    else val += std::conj(*diag--) * *p;
                }else{
                    val += *diag-- * *p;
                }
				p ++;
			}
			if( diag == diaglast ) val += *diag * *p;
			z(r,ic) += val*alpha;
			TVar *zp = &z((r-offset+1),ic);
			val = x.GetVal(r,ic);
			diag = fElem[r] + offset-1;
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) *zp += alpha * std::conj(*diag--) * val;
                    else *zp += alpha * *diag-- * val;
                }else{
                    *zp += alpha * *diag-- * val;
                }
                zp ++;
			}
		}
	}
}